

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse2_128_32.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_table_diag_sse2_128_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int *piVar1;
  uint uVar2;
  parasail_result_t *ppVar3;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  int32_t *ptr_02;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int32_t *piVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  uint uVar23;
  uint uVar24;
  __m128i_32_t A;
  int32_t iVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  __m128i vMaxHCol;
  __m128i vMaxHRow;
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  uint local_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  uint local_168 [4];
  uint local_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint local_148;
  uint uStack_144;
  uint uStack_140;
  uint uStack_13c;
  uint local_138 [4];
  uint local_128 [4];
  uint local_118 [4];
  uint local_108 [4];
  long local_f8;
  int *local_f0;
  int32_t *local_e8;
  ulong local_e0;
  ulong local_d8;
  int *local_d0;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  undefined1 local_b8 [16];
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_table_diag_sse2_128_32_cold_7();
  }
  else {
    uVar18 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      parasail_sg_flags_table_diag_sse2_128_32_cold_6();
    }
    else if (open < 0) {
      parasail_sg_flags_table_diag_sse2_128_32_cold_5();
    }
    else if (gap < 0) {
      parasail_sg_flags_table_diag_sse2_128_32_cold_4();
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      parasail_sg_flags_table_diag_sse2_128_32_cold_3();
    }
    else {
      if (matrix->type == 0) {
        if (_s1 == (char *)0x0) {
          parasail_sg_flags_table_diag_sse2_128_32_cold_2();
          return (parasail_result_t *)0x0;
        }
        if (_s1Len < 1) {
          parasail_sg_flags_table_diag_sse2_128_32_cold_1();
          return (parasail_result_t *)0x0;
        }
      }
      else {
        _s1Len = matrix->length;
      }
      iVar16 = _s1Len + 3;
      local_148 = s2Len + 3;
      iVar11 = -open;
      iVar10 = matrix->min;
      uVar6 = 0x80000000 - iVar10;
      if (iVar10 != iVar11 && SBORROW4(iVar10,iVar11) == iVar10 + open < 0) {
        uVar6 = open | 0x80000000;
      }
      uVar6 = uVar6 + 1;
      uVar19 = 0x7ffffffe - matrix->max;
      local_178 = (undefined1  [16])0x0;
      if (s1_beg == 0) {
        local_c8 = gap << 2;
        iStack_c4 = gap << 2;
        iStack_c0 = gap << 2;
        iStack_bc = gap << 2;
        local_178._4_4_ = iVar11 + gap * -2;
        local_178._0_4_ = -(gap * 3 + open);
        local_178._12_4_ = iVar11;
        local_178._8_4_ = iVar11 - gap;
      }
      else {
        local_c8 = 0;
        iStack_c4 = 0;
        iStack_c0 = 0;
        iStack_bc = 0;
      }
      local_58 = gap;
      iStack_54 = gap;
      iStack_50 = gap;
      iStack_4c = gap;
      local_108[0] = uVar6;
      local_108[1] = uVar6;
      local_168[0] = uVar6;
      local_168[1] = uVar6;
      local_138[0] = uVar6;
      local_138[1] = uVar6;
      local_128[0] = uVar6;
      local_128[1] = uVar6;
      local_118[0] = uVar6;
      local_118[1] = uVar6;
      local_108[2] = uVar6;
      local_108[3] = uVar6;
      local_168[2] = uVar6;
      local_168[3] = uVar6;
      local_138[2] = uVar6;
      local_138[3] = uVar6;
      local_128[2] = uVar6;
      local_128[3] = uVar6;
      local_118[2] = uVar6;
      local_118[3] = uVar6;
      ppVar3 = parasail_result_new_table1(_s1Len,s2Len);
      if (ppVar3 != (parasail_result_t *)0x0) {
        ppVar3->flag = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 |
                       (uint)(s2_beg != 0) << 0xe | (uint)(s2_end != 0) << 0xf | ppVar3->flag |
                       0x4421002;
        uVar8 = (ulong)(s2Len + 6);
        ptr = parasail_memalign_int32_t(0x10,uVar8);
        ptr_00 = parasail_memalign_int32_t(0x10,uVar8);
        ptr_01 = parasail_memalign_int32_t(0x10,uVar8);
        if (ptr_01 != (int32_t *)0x0 && (ptr_00 != (int32_t *)0x0 && ptr != (int32_t *)0x0)) {
          if (matrix->type == 0) {
            ptr_02 = parasail_memalign_int32_t(0x10,(long)iVar16);
            if (ptr_02 == (int32_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (0 < _s1Len) {
              piVar1 = matrix->mapper;
              uVar8 = 0;
              do {
                ptr_02[uVar8] = piVar1[(byte)_s1[uVar8]];
                uVar8 = uVar8 + 1;
              } while ((uint)_s1Len != uVar8);
            }
            iVar10 = _s1Len + 1U;
            if ((int)(_s1Len + 1U) < iVar16) {
              iVar10 = iVar16;
            }
            memset(ptr_02 + _s1Len,0,(ulong)(uint)(~_s1Len + iVar10) * 4 + 4);
          }
          else {
            ptr_02 = (int32_t *)0x0;
          }
          uVar14 = local_148;
          local_a8 = _s1Len - 1;
          uStack_a4 = _s1Len - 1;
          uStack_a0 = _s1Len - 1;
          uStack_9c = _s1Len - 1;
          local_78 = s2Len - 1;
          uStack_74 = s2Len - 1;
          uStack_70 = s2Len - 1;
          uStack_6c = s2Len - 1;
          piVar1 = matrix->mapper;
          uVar8 = 1;
          if (1 < s2Len) {
            uVar8 = uVar18;
          }
          uVar9 = 0;
          do {
            ptr[uVar9 + 3] = piVar1[(byte)_s2[uVar9]];
            uVar9 = uVar9 + 1;
          } while (uVar8 != uVar9);
          ptr[2] = 0;
          ptr[0] = 0;
          ptr[1] = 0;
          uVar7 = s2Len + 1U;
          if ((int)(s2Len + 1U) < (int)local_148) {
            uVar7 = local_148;
          }
          local_158 = uVar19;
          uStack_154 = uVar19;
          uStack_150 = uVar19;
          uStack_14c = uVar19;
          local_98 = open;
          iStack_94 = open;
          iStack_90 = open;
          iStack_8c = open;
          local_88 = s2Len;
          iStack_84 = s2Len;
          iStack_80 = s2Len;
          iStack_7c = s2Len;
          local_68 = _s1Len;
          uStack_64 = _s1Len;
          uStack_60 = _s1Len;
          uStack_5c = _s1Len;
          memset(ptr + uVar18 + 3,0,(ulong)(~s2Len + uVar7) * 4 + 4);
          uVar8 = 1;
          if (1 < s2Len) {
            uVar8 = uVar18;
          }
          uVar9 = 0;
          iVar10 = iVar11;
          if (s2_beg == 0) {
            do {
              ptr_00[uVar9 + 3] = iVar10;
              ptr_01[uVar9 + 3] = uVar6;
              uVar9 = uVar9 + 1;
              iVar10 = iVar10 - gap;
            } while (uVar8 != uVar9);
          }
          else {
            do {
              ptr_00[uVar9 + 3] = 0;
              ptr_01[uVar9 + 3] = uVar6;
              uVar9 = uVar9 + 1;
            } while (uVar8 != uVar9);
          }
          lVar4 = 0;
          do {
            ptr_00[lVar4] = uVar6;
            ptr_01[lVar4] = uVar6;
            lVar4 = lVar4 + 1;
          } while (lVar4 != 3);
          lVar4 = uVar18 + 3;
          uVar8 = uVar18;
          do {
            ptr_00[lVar4] = uVar6;
            ptr_01[lVar4] = uVar6;
            lVar4 = lVar4 + 1;
            uVar19 = (int)uVar8 + 1;
            uVar8 = (ulong)uVar19;
          } while ((int)uVar19 < (int)uVar14);
          ptr_00[2] = 0;
          if (_s1Len < 1) {
            local_188._4_4_ = uVar6;
            local_188._0_4_ = uVar6;
            local_188._12_4_ = uVar6;
            local_188._8_4_ = uVar6;
            local_198 = local_158;
            uStack_194 = uStack_154;
            uStack_190 = uStack_150;
            uStack_18c = uStack_14c;
          }
          else {
            local_f0 = matrix->matrix;
            uVar19 = _s1Len - 1;
            local_188._4_4_ = uVar6;
            local_188._0_4_ = uVar6;
            local_188._8_4_ = uVar6;
            local_188._12_4_ = uVar6;
            local_b8 = local_188 >> 0x20;
            local_d8 = 1;
            if (1 < (int)uVar14) {
              local_d8 = (ulong)uVar14;
            }
            uVar8 = (ulong)(uint)_s1Len;
            local_f8 = uVar18 * 0x10;
            local_1a0 = uVar18 * 4 + -4;
            local_1b0 = uVar18 * 0xc + -0xc;
            local_1b8 = uVar18 * 8 + -8;
            local_1d8 = 3;
            uStack_1d4 = 2;
            uStack_1d0 = 1;
            uStack_1cc = 0;
            local_1a8 = 0;
            local_e0 = 0;
            local_198 = local_158;
            uStack_194 = uStack_154;
            uStack_190 = uStack_150;
            uStack_18c = uStack_14c;
            local_e8 = ptr_02;
            piVar17 = ptr_02;
            do {
              iVar10 = matrix->type;
              uVar7 = (uint)local_e0;
              uVar14 = uVar7;
              if (iVar10 == 0) {
                uVar14 = piVar17[local_e0];
              }
              uVar9 = local_e0 | 1;
              if (iVar10 == 0) {
                uVar2 = piVar17[uVar9];
              }
              else {
                uVar2 = uVar19;
                if (uVar9 < uVar8) {
                  uVar2 = uVar7 | 1;
                }
              }
              uVar5 = local_e0 | 2;
              if (iVar10 == 0) {
                uVar20 = piVar17[uVar5];
              }
              else {
                uVar20 = uVar19;
                if (uVar5 < uVar8) {
                  uVar20 = uVar7 | 2;
                }
              }
              uVar12 = local_e0 | 3;
              if (iVar10 == 0) {
                uVar15 = piVar17[uVar12];
              }
              else {
                uVar15 = uVar19;
                if (uVar12 < uVar8) {
                  uVar15 = uVar7 | 3;
                }
              }
              iVar10 = matrix->size;
              local_d0 = local_f0 + (int)(uVar2 * iVar10);
              local_e0 = local_e0 + 4;
              uVar7 = iVar11 - uVar7 * gap;
              iVar25 = ptr_00[2];
              ptr_00[2] = iVar11 - (int)local_e0 * gap;
              if (s1_beg != 0) {
                uVar7 = 0;
              }
              local_48 = -(uint)(local_a8 == local_1d8);
              uStack_44 = -(uint)(uStack_a4 == uStack_1d4);
              uStack_40 = -(uint)(uStack_a0 == uStack_1d0);
              uStack_3c = -(uint)(uStack_9c == uStack_1cc);
              uVar13 = 0;
              uVar31 = 0xfffffffd;
              uVar32 = 0xfffffffe;
              uVar33 = 0xffffffff;
              uVar34 = 0;
              uVar35 = uVar6;
              uVar36 = uVar6;
              uVar37 = uVar6;
              uVar38 = uVar6;
              uVar23 = uVar6;
              uVar24 = uVar6;
              uVar39 = uVar6;
              uVar41 = uVar6;
              uVar43 = uVar6;
              uVar46 = uVar6;
              uVar50 = uVar6;
              uVar51 = uVar6;
              uVar52 = uVar6;
              do {
                local_148 = local_128[0];
                uStack_144 = local_128[1];
                uStack_140 = local_128[2];
                uStack_13c = local_128[3];
                iVar16 = ptr_00[uVar13 + 3];
                uVar37 = (local_f0 + (int)(uVar2 * iVar10))[ptr[uVar13 + 2]] + uVar37;
                uVar45 = iVar16 - iStack_8c;
                uVar26 = -(uint)((int)(uVar50 - local_58) < (int)(uVar23 - local_98));
                uVar28 = -(uint)((int)(uVar51 - iStack_54) < (int)(uVar24 - iStack_94));
                uVar29 = -(uint)((int)(uVar52 - iStack_50) < (int)(uVar7 - iStack_90));
                uVar30 = -(uint)(ptr_01[uVar13 + 3] - iStack_4c < (int)uVar45);
                uVar27 = ~uVar26 & uVar50 - local_58 | uVar23 - local_98 & uVar26;
                uVar50 = ~uVar28 & uVar51 - iStack_54 | uVar24 - iStack_94 & uVar28;
                uVar51 = ~uVar29 & uVar52 - iStack_50 | uVar7 - iStack_90 & uVar29;
                uVar52 = ~uVar30 & ptr_01[uVar13 + 3] - iStack_4c | uVar45 & uVar30;
                uVar26 = -(uint)((int)(uVar39 - local_58) < (int)(uVar38 - local_98));
                uVar28 = -(uint)((int)(uVar41 - iStack_54) < (int)(uVar23 - iStack_94));
                uVar29 = -(uint)((int)(uVar43 - iStack_50) < (int)(uVar24 - iStack_90));
                uVar30 = -(uint)((int)(uVar46 - iStack_4c) < (int)(uVar7 - iStack_8c));
                uVar48 = ~uVar26 & uVar39 - local_58 | uVar38 - local_98 & uVar26;
                uVar49 = ~uVar28 & uVar41 - iStack_54 | uVar23 - iStack_94 & uVar28;
                uVar40 = ~uVar29 & uVar43 - iStack_50 | uVar24 - iStack_90 & uVar29;
                uVar42 = ~uVar30 & uVar46 - iStack_4c | uVar7 - iStack_8c & uVar30;
                uVar38 = -(uint)((int)uVar48 <
                                (int)(local_f0[(long)(int)(uVar15 * iVar10) + (long)ptr[uVar13]] +
                                     uVar35));
                uVar41 = -(uint)((int)uVar49 <
                                (int)(local_f0[(long)(int)(uVar20 * iVar10) + (long)ptr[uVar13 + 1]]
                                     + uVar36));
                uVar43 = -(uint)((int)uVar40 < (int)uVar37);
                uVar46 = -(uint)((int)uVar42 <
                                local_f0[(long)(int)(uVar14 * iVar10) + (long)ptr[uVar13 + 3]] +
                                iVar25);
                uVar39 = ~uVar38 & uVar48 |
                         local_f0[(long)(int)(uVar15 * iVar10) + (long)ptr[uVar13]] + uVar35 &
                         uVar38;
                uVar41 = ~uVar41 & uVar49 |
                         local_f0[(long)(int)(uVar20 * iVar10) + (long)ptr[uVar13 + 1]] + uVar36 &
                         uVar41;
                uVar43 = ~uVar43 & uVar40 | uVar37 & uVar43;
                uVar46 = ~uVar46 & uVar42 |
                         local_f0[(long)(int)(uVar14 * iVar10) + (long)ptr[uVar13 + 3]] + iVar25 &
                         uVar46;
                uVar35 = -(uint)((int)uVar27 < (int)uVar39);
                uVar36 = -(uint)((int)uVar50 < (int)uVar41);
                uVar37 = -(uint)((int)uVar51 < (int)uVar43);
                uVar38 = -(uint)((int)uVar52 < (int)uVar46);
                uVar35 = ~uVar35 & uVar27 | uVar39 & uVar35;
                uVar36 = ~uVar36 & uVar50 | uVar41 & uVar36;
                uVar37 = ~uVar37 & uVar51 | uVar43 & uVar37;
                uVar30 = ~uVar38 & uVar52 | uVar46 & uVar38;
                uVar45 = -(uint)(uVar31 == 0xffffffff);
                uVar41 = -(uint)(uVar32 == 0xffffffff);
                uVar43 = -(uint)(uVar33 == 0xffffffff);
                uVar46 = -(uint)(uVar34 == 0xffffffff);
                uVar38 = local_178._0_4_ & uVar45 | ~uVar45 & uVar35;
                uVar26 = local_178._4_4_ & uVar41 | ~uVar41 & uVar36;
                uVar28 = local_178._8_4_ & uVar43 | ~uVar43 & uVar37;
                uVar29 = local_178._12_4_ & uVar46 | ~uVar46 & uVar30;
                if (3 < uVar13) {
                  local_198 = ~-(uint)((int)uVar38 < (int)local_198) & local_198 |
                              uVar38 & -(uint)((int)uVar38 < (int)local_198);
                  uStack_194 = ~-(uint)((int)uVar26 < (int)uStack_194) & uStack_194 |
                               uVar26 & -(uint)((int)uVar26 < (int)uStack_194);
                  uStack_190 = ~-(uint)((int)uVar28 < (int)uStack_190) & uStack_190 |
                               uVar28 & -(uint)((int)uVar28 < (int)uStack_190);
                  uStack_18c = ~-(uint)((int)uVar29 < (int)uStack_18c) & uStack_18c |
                               uVar29 & -(uint)((int)uVar29 < (int)uStack_18c);
                  local_188._4_4_ =
                       local_188._4_4_ & -(uint)((int)uVar26 < (int)local_188._4_4_) |
                       ~-(uint)((int)uVar26 < (int)local_188._4_4_) & uVar26;
                  local_188._0_4_ =
                       local_188._0_4_ & -(uint)((int)uVar38 < (int)local_188._0_4_) |
                       ~-(uint)((int)uVar38 < (int)local_188._0_4_) & uVar38;
                  local_188._8_4_ =
                       local_188._8_4_ & -(uint)((int)uVar28 < (int)local_188._8_4_) |
                       ~-(uint)((int)uVar28 < (int)local_188._8_4_) & uVar28;
                  local_188._12_4_ =
                       local_188._12_4_ & -(uint)((int)uVar29 < (int)local_188._12_4_) |
                       ~-(uint)((int)uVar29 < (int)local_188._12_4_) & uVar29;
                }
                piVar1 = ((ppVar3->field_4).rowcols)->score_row;
                if (uVar13 < uVar18) {
                  *(uint *)((long)piVar1 + uVar13 * 4 + local_1a8) = uVar29;
                }
                if (uVar13 - 1 < uVar18 && uVar9 < uVar8) {
                  *(uint *)((long)piVar1 + uVar13 * 4 + local_1a0) = uVar28;
                }
                if ((uVar5 < uVar8) && ((long)(uVar13 - 2) < (long)uVar18 && 1 < uVar13)) {
                  *(uint *)((long)piVar1 + uVar13 * 4 + local_1b8) = uVar26;
                }
                uVar50 = ~uVar41 & uVar50 | uVar6 & uVar41;
                uVar51 = ~uVar43 & uVar51 | uVar6 & uVar43;
                uVar52 = ~uVar46 & uVar52 | uVar6 & uVar46;
                if ((uVar12 < uVar8) && ((long)(uVar13 - 3) < (long)uVar18 && 2 < uVar13)) {
                  *(uint *)((long)piVar1 + uVar13 * 4 + local_1b0) = uVar38;
                }
                uVar39 = uVar6 & uVar45 | ~uVar45 & uVar48;
                uVar41 = uVar6 & uVar41 | ~uVar41 & uVar49;
                uVar43 = uVar6 & uVar43 | ~uVar43 & uVar40;
                uVar46 = uVar6 & uVar46 | ~uVar46 & uVar42;
                ptr_00[uVar13] = uVar38;
                ptr_01[uVar13] = ~uVar45 & uVar27 | uVar6 & uVar45;
                uVar40 = ~((int)uVar31 >> 0x1f) & -(uint)((int)uVar31 < local_88) & local_48 &
                         -(uint)((int)local_108[0] < (int)uVar38);
                uVar42 = ~((int)uVar32 >> 0x1f) & -(uint)((int)uVar32 < iStack_84) & uStack_44 &
                         -(uint)((int)local_108[1] < (int)uVar26);
                uVar44 = ~((int)uVar33 >> 0x1f) & -(uint)((int)uVar33 < iStack_80) & uStack_40 &
                         -(uint)((int)local_108[2] < (int)uVar28);
                uVar47 = ~((int)uVar34 >> 0x1f) & -(uint)((int)uVar34 < iStack_7c) & uStack_3c &
                         -(uint)((int)local_108[3] < (int)uVar29);
                uVar27 = -(uint)((int)local_118[0] < (int)uVar38 &&
                                ((int)local_1d8 < (int)local_68 && local_78 == uVar31));
                uVar45 = -(uint)((int)local_118[1] < (int)uVar26 &&
                                ((int)uStack_1d4 < (int)uStack_64 && uStack_74 == uVar32));
                uVar48 = -(uint)((int)local_118[2] < (int)uVar28 &&
                                ((int)uStack_1d0 < (int)uStack_60 && uStack_70 == uVar33));
                uVar49 = -(uint)((int)local_118[3] < (int)uVar29 &&
                                ((int)uStack_1cc < (int)uStack_5c && uStack_6c == uVar34));
                local_108[0] = uVar35 & uVar40 | ~uVar40 & local_108[0];
                local_108[1] = uVar36 & uVar42 | ~uVar42 & local_108[1];
                local_108[2] = uVar37 & uVar44 | ~uVar44 & local_108[2];
                local_108[3] = uVar30 & uVar47 | ~uVar47 & local_108[3];
                uVar35 = -(uint)(local_78 == uVar31 && local_a8 == local_1d8);
                uVar36 = -(uint)(uStack_74 == uVar32 && uStack_a4 == uStack_1d4);
                uVar37 = -(uint)(uStack_70 == uVar33 && uStack_a0 == uStack_1d0);
                uVar30 = -(uint)(uStack_6c == uVar34 && uStack_9c == uStack_1cc);
                local_118[0] = uVar38 & uVar27 | ~uVar27 & local_118[0];
                local_118[1] = uVar26 & uVar45 | ~uVar45 & local_118[1];
                local_118[2] = uVar28 & uVar48 | ~uVar48 & local_118[2];
                local_118[3] = uVar29 & uVar49 | ~uVar49 & local_118[3];
                local_128[0] = ~uVar35 & local_128[0] | uVar38 & uVar35;
                local_128[1] = ~uVar36 & local_128[1] | uVar26 & uVar36;
                local_128[2] = ~uVar37 & local_128[2] | uVar28 & uVar37;
                local_128[3] = ~uVar30 & local_128[3] | uVar29 & uVar30;
                local_168[0] = ~uVar27 & local_168[0] | local_1d8 & uVar27;
                local_168[1] = ~uVar45 & local_168[1] | uStack_1d4 & uVar45;
                local_168[2] = ~uVar48 & local_168[2] | uStack_1d0 & uVar48;
                local_168[3] = ~uVar49 & local_168[3] | uStack_1cc & uVar49;
                local_138[0] = ~uVar40 & local_138[0] | uVar31 & uVar40;
                local_138[1] = ~uVar42 & local_138[1] | uVar32 & uVar42;
                local_138[2] = ~uVar44 & local_138[2] | uVar33 & uVar44;
                local_138[3] = ~uVar47 & local_138[3] | uVar34 & uVar47;
                uVar31 = uVar31 + 1;
                uVar32 = uVar32 + 1;
                uVar33 = uVar33 + 1;
                uVar34 = uVar34 + 1;
                uVar13 = uVar13 + 1;
                uVar35 = uVar23;
                uVar36 = uVar24;
                uVar37 = uVar7;
                iVar25 = iVar16;
                uVar23 = uVar26;
                uVar24 = uVar28;
                uVar7 = uVar29;
              } while (local_d8 != uVar13);
              local_1d8 = local_1d8 + 4;
              uStack_1d4 = uStack_1d4 + 4;
              uStack_1d0 = uStack_1d0 + 4;
              uStack_1cc = uStack_1cc + 4;
              local_178._4_4_ = local_178._4_4_ - iStack_c4;
              local_178._0_4_ = local_178._0_4_ - local_c8;
              local_178._8_4_ = local_178._8_4_ - iStack_c0;
              local_178._12_4_ = local_178._12_4_ - iStack_bc;
              local_1a8 = local_1a8 + local_f8;
              local_1a0 = local_1a0 + local_f8;
              local_1b0 = local_1b0 + local_f8;
              local_1b8 = local_1b8 + local_f8;
              piVar17 = local_e8;
            } while (local_e0 < uVar8);
          }
          lVar4 = 0;
          uVar19 = 0;
          uVar14 = 0;
          uVar7 = uVar6;
          uVar2 = uVar6;
          uVar20 = uVar6;
          do {
            uVar15 = local_118[lVar4];
            if (((int)uVar2 < (int)uVar15) ||
               ((uVar15 == uVar2 && ((int)local_168[lVar4] < (int)uVar19)))) {
              uVar19 = local_168[lVar4];
              uVar2 = uVar15;
            }
            if ((int)uVar20 < (int)local_108[lVar4]) {
              uVar14 = local_138[lVar4];
              uVar20 = local_108[lVar4];
            }
            if ((int)uVar7 < (int)local_128[lVar4]) {
              uVar7 = local_128[lVar4];
            }
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 != 4);
          if (s1_end == 0 || s2_end == 0) {
            if (s1_end == 0) {
              uVar19 = _s1Len - 1;
              uVar2 = s2Len - 1;
              if (s2_end != 0) {
                uVar7 = uVar20;
                uVar2 = uVar14;
              }
            }
            else {
              uVar7 = uVar2;
              uVar2 = s2Len - 1;
            }
          }
          else if (((int)uVar20 < (int)uVar2) || (s2Len - 1U == uVar14 && uVar2 == uVar20)) {
            uVar7 = uVar2;
            uVar2 = s2Len - 1;
          }
          else {
            uVar19 = _s1Len - 1;
            uVar7 = uVar20;
            uVar2 = uVar14;
          }
          auVar21._0_4_ = -(uint)((int)local_198 < (int)uVar6);
          auVar21._4_4_ = -(uint)((int)uStack_194 < (int)uVar6);
          auVar21._8_4_ = -(uint)((int)uStack_190 < (int)uVar6);
          auVar21._12_4_ = -(uint)((int)uStack_18c < (int)uVar6);
          auVar22._0_4_ = -(uint)((int)local_158 < (int)local_188._0_4_);
          auVar22._4_4_ = -(uint)((int)uStack_154 < (int)local_188._4_4_);
          auVar22._8_4_ = -(uint)((int)uStack_150 < (int)local_188._8_4_);
          auVar22._12_4_ = -(uint)((int)uStack_14c < (int)local_188._12_4_);
          iVar10 = movmskps(uVar20,auVar22 | auVar21);
          if (iVar10 != 0) {
            *(byte *)&ppVar3->flag = (byte)ppVar3->flag | 0x40;
            uVar7 = 0;
            uVar2 = 0;
            uVar19 = 0;
          }
          ppVar3->score = uVar7;
          ppVar3->end_query = uVar19;
          ppVar3->end_ref = uVar2;
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          if (matrix->type == 0) {
            parasail_free(ptr_02);
            return ppVar3;
          }
          return ppVar3;
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi32(NEG_LIMIT);
    vOpen = _mm_set1_epi32(open);
    vGap  = _mm_set1_epi32(gap);
    vOne = _mm_set1_epi32(1);
    vN = _mm_set1_epi32(N);
    vGapN = s1_beg ? _mm_set1_epi32(0) : _mm_set1_epi32(gap*N);
    vNegOne = _mm_set1_epi32(-1);
    vI = _mm_set_epi32(0,1,2,3);
    vJreset = _mm_set_epi32(0,-1,-2,-3);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi32(s1Len);
    vILimit1 = _mm_sub_epi32(vILimit, vOne);
    vJLimit = _mm_set1_epi32(s2Len);
    vJLimit1 = _mm_sub_epi32(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi32(0) : _mm_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        __m128i vIltLimit = _mm_cmplt_epi32(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi32(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 4);
        vNH = _mm_insert_epi32_rpl(vNH, H_pr[-1], 3);
        vWH = _mm_srli_si128(vWH, 4);
        vWH = _mm_insert_epi32_rpl(vWH, s1_beg ? 0 : (-open - i*gap), 3);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 4);
            vNH = _mm_insert_epi32_rpl(vNH, H_pr[j], 3);
            vF = _mm_srli_si128(vF, 4);
            vF = _mm_insert_epi32_rpl(vF, F_pr[j], 3);
            vF = _mm_max_epi32_rpl(
                    _mm_sub_epi32(vNH, vOpen),
                    _mm_sub_epi32(vF, vGap));
            vE = _mm_max_epi32_rpl(
                    _mm_sub_epi32(vWH, vOpen),
                    _mm_sub_epi32(vE, vGap));
            vMat = _mm_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm_add_epi32(vNWH, vMat);
            vWH = _mm_max_epi32_rpl(vNWH, vE);
            vWH = _mm_max_epi32_rpl(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm_blendv_epi8_rpl(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int32_t)_mm_extract_epi32_rpl(vWH,0);
            F_pr[j-3] = (int32_t)_mm_extract_epi32_rpl(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi32(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi32(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi32(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi32(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi32(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8_rpl(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8_rpl(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8_rpl(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_add_epi32(vJ, vOne);
        }
        vI = _mm_add_epi32(vI, vN);
        vIBoundary = _mm_sub_epi32(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int32_t max_row = NEG_LIMIT;
        int32_t max_col = NEG_LIMIT;
        int32_t last_val = NEG_LIMIT;
        int32_t *s = (int32_t*)&vMaxHRow;
        int32_t *t = (int32_t*)&vMaxHCol;
        int32_t *u = (int32_t*)&vLastVal;
        int32_t *i = (int32_t*)&vEndI;
        int32_t *j = (int32_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}